

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressBegin_usingCDict_internal
                 (ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  unsigned_long_long uVar7;
  ZSTD_parameters local_118;
  ZSTD_CCtx_params cctxParams;
  
  local_118.fParams.noDictIDFlag = fParams.noDictIDFlag;
  local_118.fParams._0_8_ = fParams._0_8_;
  if (cdict == (ZSTD_CDict *)0x0) {
    return 0xffffffffffffffe0;
  }
  if ((((pledgedSrcSize < 0x20000) || (pledgedSrcSize == 0xffffffffffffffff)) ||
      (uVar5 = cdict->dictContentSize * 6, pledgedSrcSize <= uVar5 && uVar5 - pledgedSrcSize != 0))
     || (cdict->compressionLevel == 0)) {
    local_118.cParams.windowLog = (cdict->matchState).cParams.windowLog;
    local_118.cParams.chainLog = (cdict->matchState).cParams.chainLog;
    uVar1 = (cdict->matchState).cParams.hashLog;
    uVar2 = (cdict->matchState).cParams.searchLog;
    uVar3 = (cdict->matchState).cParams.minMatch;
    local_118.cParams.targetLength = (cdict->matchState).cParams.targetLength;
    local_118.cParams.strategy = (cdict->matchState).cParams.strategy;
    local_118.cParams.hashLog = uVar1;
    local_118.cParams.searchLog = uVar2;
    local_118.cParams.minMatch = uVar3;
  }
  else {
    ZSTD_getCParams(&local_118.cParams,cdict->compressionLevel,pledgedSrcSize,cdict->dictContentSize
                   );
  }
  ZSTD_CCtxParams_init_internal(&cctxParams,&local_118,cdict->compressionLevel);
  uVar4 = cctxParams.cParams.windowLog;
  if (pledgedSrcSize != 0xffffffffffffffff) {
    if (pledgedSrcSize < 2) {
      uVar4 = 1;
    }
    else {
      uVar7 = 0x80000;
      if (pledgedSrcSize < 0x80000) {
        uVar7 = pledgedSrcSize;
      }
      uVar4 = ZSTD_highbit32((int)uVar7 - 1);
      uVar4 = uVar4 + 1;
    }
    if (uVar4 < cctxParams.cParams.windowLog) {
      uVar4 = cctxParams.cParams.windowLog;
    }
  }
  cctxParams.cParams.windowLog = uVar4;
  sVar6 = ZSTD_compressBegin_internal
                    (cctx,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,cdict,&cctxParams,
                     pledgedSrcSize,ZSTDb_not_buffered);
  return sVar6;
}

Assistant:

static size_t ZSTD_compressBegin_usingCDict_internal(
    ZSTD_CCtx* const cctx, const ZSTD_CDict* const cdict,
    ZSTD_frameParameters const fParams, unsigned long long const pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams;
    DEBUGLOG(4, "ZSTD_compressBegin_usingCDict_internal");
    RETURN_ERROR_IF(cdict==NULL, dictionary_wrong, "NULL pointer!");
    /* Initialize the cctxParams from the cdict */
    {
        ZSTD_parameters params;
        params.fParams = fParams;
        params.cParams = ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
                        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
                        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
                        || cdict->compressionLevel == 0 ) ?
                ZSTD_getCParamsFromCDict(cdict)
              : ZSTD_getCParams(cdict->compressionLevel,
                                pledgedSrcSize,
                                cdict->dictContentSize);
        ZSTD_CCtxParams_init_internal(&cctxParams, &params, cdict->compressionLevel);
    }
    /* Increase window log to fit the entire dictionary and source if the
     * source size is known. Limit the increase to 19, which is the
     * window log for compression level 1 with the largest source size.
     */
    if (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
        U32 const limitedSrcSize = (U32)MIN(pledgedSrcSize, 1U << 19);
        U32 const limitedSrcLog = limitedSrcSize > 1 ? ZSTD_highbit32(limitedSrcSize - 1) + 1 : 1;
        cctxParams.cParams.windowLog = MAX(cctxParams.cParams.windowLog, limitedSrcLog);
    }
    return ZSTD_compressBegin_internal(cctx,
                                        NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                        cdict,
                                        &cctxParams, pledgedSrcSize,
                                        ZSTDb_not_buffered);
}